

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Vec4 *p)

{
  string *psVar1;
  float fVar2;
  float fVar3;
  ostringstream msg;
  undefined1 auStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_188);
  fVar3 = *(float *)this;
  fVar2 = *(float *)(this + 0xc);
  if (fVar3 < -fVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(-X clip)",10);
    fVar3 = *(float *)this;
    fVar2 = *(float *)(this + 0xc);
  }
  if (fVar2 < fVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(+X clip)",10);
    fVar2 = *(float *)(this + 0xc);
  }
  fVar3 = *(float *)(this + 4);
  if (fVar3 < -fVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(-Y clip)",10);
    fVar3 = *(float *)(this + 4);
    fVar2 = *(float *)(this + 0xc);
  }
  if (fVar2 < fVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(+Y clip)",10);
    fVar2 = *(float *)(this + 0xc);
  }
  fVar3 = *(float *)(this + 8);
  if (fVar3 < -fVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(-Z clip)",10);
    fVar3 = *(float *)(this + 8);
    fVar2 = *(float *)(this + 0xc);
  }
  if (fVar2 < fVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\t(+Z clip)",10);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_188);
  psVar1 = (string *)std::ios_base::~ios_base((ios_base *)(auStack_188 + 0x70));
  return psVar1;
}

Assistant:

std::string genClippingPointInfoString(const tcu::Vec4& p)
{
	std::ostringstream msg;

	if (p.x() < -p.w())		msg << "\t(-X clip)";
	if (p.x() >  p.w())		msg << "\t(+X clip)";
	if (p.y() < -p.w())		msg << "\t(-Y clip)";
	if (p.y() >  p.w())		msg << "\t(+Y clip)";
	if (p.z() < -p.w())		msg << "\t(-Z clip)";
	if (p.z() >  p.w())		msg << "\t(+Z clip)";

	return msg.str();
}